

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpcf_re_repeat(int n,mpc_val_t **xs)

{
  char cVar1;
  undefined4 uVar2;
  char *__ptr;
  undefined8 *puVar3;
  mpc_val_t *pmVar4;
  
  __ptr = (char *)xs[1];
  if (__ptr == (char *)0x0) {
    puVar3 = (undefined8 *)*xs;
  }
  else {
    cVar1 = *__ptr;
    if (cVar1 == '?') {
      free(__ptr);
      pmVar4 = *xs;
      puVar3 = (undefined8 *)calloc(1,0x38);
      *puVar3 = 0;
      *(undefined2 *)(puVar3 + 6) = 0x13;
      puVar3[1] = pmVar4;
      puVar3[3] = mpcf_ctor_str;
    }
    else {
      if (cVar1 == '+') {
        free(__ptr);
        pmVar4 = *xs;
        puVar3 = (undefined8 *)calloc(1,0x38);
        *puVar3 = 0;
        *(undefined2 *)(puVar3 + 6) = 0x15;
      }
      else {
        if (cVar1 != '*') {
          uVar2 = *(undefined4 *)__ptr;
          free(__ptr);
          pmVar4 = *xs;
          puVar3 = (undefined8 *)calloc(1,0x38);
          *puVar3 = 0;
          *(undefined2 *)(puVar3 + 6) = 0x16;
          *(undefined4 *)(puVar3 + 1) = uVar2;
          puVar3[2] = mpcf_strfold;
          puVar3[3] = pmVar4;
          puVar3[4] = free;
          return puVar3;
        }
        free(__ptr);
        pmVar4 = *xs;
        puVar3 = (undefined8 *)calloc(1,0x38);
        *puVar3 = 0;
        *(undefined2 *)(puVar3 + 6) = 0x14;
      }
      puVar3[3] = pmVar4;
      puVar3[2] = mpcf_strfold;
    }
  }
  return puVar3;
}

Assistant:

static mpc_val_t *mpcf_re_repeat(int n, mpc_val_t **xs) {
  int num;
  (void) n;
  if (xs[1] == NULL) { return xs[0]; }
  switch(((char*)xs[1])[0])
  {
    case '*': { free(xs[1]); return mpc_many(mpcf_strfold, xs[0]); }; break;
    case '+': { free(xs[1]); return mpc_many1(mpcf_strfold, xs[0]); }; break;
    case '?': { free(xs[1]); return mpc_maybe_lift(xs[0], mpcf_ctor_str); }; break;
    default:
      num = *(int*)xs[1];
      free(xs[1]);
  }

  return mpc_count(num, mpcf_strfold, xs[0], free);
}